

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

uint32_t __thiscall
diligent_spirv_cross::CompilerGLSL::get_accumulated_member_location
          (CompilerGLSL *this,SPIRVariable *var,uint32_t mbr_idx,bool strip_array)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  SPIRType *pSVar4;
  SPIRType *type;
  undefined7 in_register_00000009;
  ulong uVar5;
  
  if ((int)CONCAT71(in_register_00000009,strip_array) == 0) {
    pSVar4 = Compiler::get_variable_data_type(&this->super_Compiler,var);
  }
  else {
    pSVar4 = Compiler::get_variable_element_type(&this->super_Compiler,var);
  }
  uVar2 = Compiler::get_decoration
                    (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationLocation);
  for (uVar5 = 0; mbr_idx != uVar5; uVar5 = uVar5 + 1) {
    type = Compiler::get<diligent_spirv_cross::SPIRType>
                     (&this->super_Compiler,
                      (pSVar4->member_types).
                      super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                      .ptr[uVar5].id);
    bVar1 = Compiler::has_member_decoration
                      (&this->super_Compiler,(TypeID)(pSVar4->super_IVariant).self.id,mbr_idx,
                       DecorationLocation);
    if (bVar1) {
      uVar2 = Compiler::get_member_decoration
                        (&this->super_Compiler,(TypeID)(pSVar4->super_IVariant).self.id,mbr_idx,
                         DecorationLocation);
    }
    uVar3 = type_to_location_count(this,type);
    uVar2 = uVar2 + uVar3;
  }
  return uVar2;
}

Assistant:

uint32_t CompilerGLSL::get_accumulated_member_location(const SPIRVariable &var, uint32_t mbr_idx, bool strip_array) const
{
	auto &type = strip_array ? get_variable_element_type(var) : get_variable_data_type(var);
	uint32_t location = get_decoration(var.self, DecorationLocation);

	for (uint32_t i = 0; i < mbr_idx; i++)
	{
		auto &mbr_type = get<SPIRType>(type.member_types[i]);

		// Start counting from any place we have a new location decoration.
		if (has_member_decoration(type.self, mbr_idx, DecorationLocation))
			location = get_member_decoration(type.self, mbr_idx, DecorationLocation);

		uint32_t location_count = type_to_location_count(mbr_type);
		location += location_count;
	}

	return location;
}